

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_custom.cpp
# Opt level: O3

bool ImGui::DragDoubleRange2
               (char *label,double *v_current_min,double *v_current_max,float v_speed,double v_min,
               double v_max,char *format,char *format_max,float power)

{
  double dVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  char *text_end;
  float w_full;
  double local_58;
  double local_50;
  double local_48;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    local_48 = v_min;
    PushID(label);
    BeginGroup();
    w_full = CalcItemWidth();
    PushMultiItemsWidths(2,w_full);
    local_50 = (double)(~-(ulong)(v_max <= local_48) & (ulong)local_48 |
                       -(ulong)(v_max <= local_48) & 0xc7efffffe0000000);
    dVar1 = *v_current_max;
    local_58 = dVar1;
    if ((local_48 < v_max) && (local_58 = v_max, dVar1 <= v_max)) {
      local_58 = dVar1;
    }
    bVar4 = DragScalar("##min",9,v_current_min,v_speed,&local_50,&local_58,format,power);
    PopItemWidth();
    SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
    local_50 = *v_current_min;
    if (v_max <= local_48) {
      v_max = 3.4028234663852886e+38;
    }
    else {
      local_50 = (double)(~-(ulong)(local_50 <= local_48) & (ulong)local_50 |
                         (ulong)local_48 & -(ulong)(local_50 <= local_48));
    }
    if (format_max != (char *)0x0) {
      format = format_max;
    }
    local_58 = v_max;
    bVar5 = DragScalar("##max",9,v_current_max,v_speed,&local_50,&local_58,format,power);
    bVar4 = bVar4 || bVar5;
    PopItemWidth();
    SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextEx(label,text_end,0);
    EndGroup();
    PopID();
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool DragDoubleRange2(const char *label, double *v_current_min, double *v_current_max,
                      float v_speed, double v_min, double v_max, const char *format,
                      const char *format_max, float power) {
    ImGuiWindow *window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext &g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    bool value_changed =
        DragDouble("##min", v_current_min, v_speed, (v_min >= v_max) ? -FLT_MAX : v_min,
                   (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max), format, power);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);
    value_changed |=
        DragDouble("##max", v_current_max, v_speed,
                   (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min),
                   (v_min >= v_max) ? FLT_MAX : v_max, format_max ? format_max : format, power);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();
    return value_changed;
}